

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::SendMessage
          (V2TransportTester *this,uint8_t short_id,Span<const_unsigned_char> payload)

{
  Span<const_unsigned_char> aad;
  reference pvVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __result;
  iterator iVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var3;
  value_type in_SIL;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> contents;
  Span<const_unsigned_char> *in_stack_ffffffffffffff18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  uchar *__first;
  allocator_type *in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff48;
  undefined1 ignore;
  V2TransportTester *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffffc8;
  Span<const_unsigned_char> in_stack_ffffffffffffffd0;
  uchar local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Span<const_unsigned_char>::size(in_stack_ffffffffffffff18);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffff18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffff18);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT17(in_SIL,in_stack_ffffffffffffff28),
                      (size_type)in_stack_ffffffffffffff20);
  *pvVar1 = in_SIL;
  __first = local_18;
  Span<const_unsigned_char>::begin(in_stack_ffffffffffffff18);
  __result._M_current = Span<const_unsigned_char>::end(in_stack_ffffffffffffff18);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    (in_stack_ffffffffffffff20);
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)CONCAT17(in_SIL,in_stack_ffffffffffffff28),
                      (difference_type)in_stack_ffffffffffffff20);
  ignore = (undefined1)((ulong)_Var3._M_current >> 0x38);
  std::
  copy<unsigned_char_const*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (__first,(uchar *)CONCAT17(in_SIL,in_stack_ffffffffffffff28),__result);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)CONCAT17(in_SIL,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Span<const_unsigned_char>::Span(in_stack_ffffffffffffff18);
  aad.m_size = in_stack_ffffffffffffffc8;
  aad.m_data = iVar2._M_current;
  SendPacket(in_stack_ffffffffffffff80,in_stack_ffffffffffffffd0,aad,(bool)ignore);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_SIL,in_stack_ffffffffffffff28));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendMessage(uint8_t short_id, Span<const uint8_t> payload)
    {
        // Construct contents consisting of short_id + payload.
        std::vector<uint8_t> contents(1 + payload.size());
        contents[0] = short_id;
        std::copy(payload.begin(), payload.end(), contents.begin() + 1);
        // Send a packet with that as contents.
        SendPacket(contents);
    }